

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strscan.c
# Opt level: O3

StrScanFmt
strscan_dec(uint8_t *p,TValue *o,StrScanFmt fmt,uint32_t opt,int32_t ex10,int32_t neg,uint32_t dig)

{
  uint uVar1;
  int iVar2;
  byte *pbVar3;
  byte bVar4;
  long lVar5;
  byte *__s;
  byte bVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  bool bVar17;
  double dVar18;
  uint8_t xi [512];
  undefined4 local_23c;
  byte local_238 [520];
  ulong uVar13;
  
  if (dig == 0) {
    __s = local_238;
    local_238[0] = 0;
    uVar14 = 0;
    goto LAB_0012b3e3;
  }
  uVar14 = 0;
  iVar2 = dig - 800;
  if (dig < 800) {
    iVar2 = 0;
  }
  uVar1 = 800;
  if (dig < 800) {
    uVar1 = dig;
  }
  uVar10 = iVar2 + ex10;
  if (((uVar10 ^ uVar1) & 1) != 0) {
    bVar4 = *p;
    if (bVar4 == 0x2e) {
      bVar4 = p[1];
      p = p + 1;
    }
    local_238[0] = bVar4 & 0xf;
    uVar1 = uVar1 - 1;
    p = p + 1;
    uVar14 = 1;
  }
  uVar15 = uVar14;
  if (1 < uVar1) {
    uVar15 = (ulong)((uVar1 - 2 >> 1) + (int)uVar14 + 1);
    do {
      bVar4 = *p;
      if (bVar4 == 0x2e) {
        bVar4 = p[1];
        p = p + 1;
      }
      bVar6 = p[1];
      lVar5 = 1;
      if (bVar6 == 0x2e) {
        bVar6 = p[2];
        lVar5 = 2;
      }
      local_238[uVar14] = (bVar6 & 0xf) + (bVar4 & 0xf) * '\n';
      uVar14 = uVar14 + 1;
      p = p + lVar5 + 1;
      uVar1 = uVar1 - 2;
    } while (uVar15 != uVar14);
  }
  if (uVar1 != 0) {
    bVar4 = *p;
    if (bVar4 == 0x2e) {
      bVar4 = p[1];
      p = p + 1;
    }
    local_238[uVar15] = (bVar4 & 0xf) * '\n';
    uVar15 = uVar15 + 1;
    uVar10 = uVar10 - 1;
    dig = dig + 1;
    p = p + 1;
  }
  __s = local_238 + uVar15;
  if (dig < 0x321) {
    if (dig < 0x13 && 0 < (int)uVar10) {
      iVar2 = 0x11 - dig;
      if (0x11 < dig) {
        iVar2 = 0;
      }
      uVar1 = iVar2 + 1U >> 1;
      iVar2 = uVar10 - 2;
      if (uVar10 < 2) {
        iVar2 = 0;
      }
      uVar16 = iVar2 + 1U >> 1;
      if (uVar1 < uVar16) {
        uVar16 = uVar1;
      }
      local_23c = neg;
      memset(__s,0,(ulong)uVar16 + 1);
      uVar15 = uVar15 + uVar16 + 1;
      uVar10 = (uVar10 + uVar16 * -2) - 2;
      dig = dig + 2 + uVar16 * 2;
      neg = local_23c;
    }
    __s = local_238 + uVar15;
    if ((uVar10 != 0) || (0x14 < dig)) goto LAB_0012b517;
    uVar14 = (ulong)local_238[0];
    if (1 < uVar15) {
      pbVar3 = local_238 + 1;
      do {
        uVar14 = (ulong)*pbVar3 + uVar14 * 100;
        pbVar3 = pbVar3 + 1;
      } while (pbVar3 < __s);
    }
    if (dig == 0x14) {
      uVar10 = 0;
      if ((0x12 < local_238[0]) || (uVar10 = 0, -1 < (long)uVar14)) goto LAB_0012b517;
    }
LAB_0012b3e3:
    iVar2 = (int)__s;
    if (fmt - STRSCAN_I64 < 2) {
      uVar15 = -uVar14;
      goto LAB_0012b5b7;
    }
    iVar8 = (int)uVar14;
    if (fmt == STRSCAN_U32) {
LAB_0012b55c:
      if (uVar14 >> 0x20 != 0) {
        return STRSCAN_ERROR;
      }
      iVar2 = -iVar8;
      if (neg == 0) {
        iVar2 = iVar8;
      }
      (o->field_4).i = iVar2;
      return STRSCAN_U32;
    }
    if (fmt == STRSCAN_INT) {
      if (((opt & 2) == 0) && (uVar14 < (neg | 0x80000000))) {
        iVar2 = -iVar8;
        if (neg == 0) {
          iVar2 = iVar8;
        }
        (o->field_4).i = iVar2;
        return STRSCAN_INT;
      }
      fmt = STRSCAN_NUM;
      if ((opt & 0x10) != 0) goto LAB_0012b55c;
    }
    if (-1 < (long)uVar14) {
      dVar18 = (double)(long)uVar14;
      if (neg != 0) {
        dVar18 = -dVar18;
      }
      goto LAB_0012b5dd;
    }
    uVar10 = 0;
LAB_0012b57e:
    if (STRSCAN_INT < fmt) {
      return STRSCAN_ERROR;
    }
  }
  else {
    do {
      bVar4 = *p;
      if (bVar4 == 0x2e) {
        bVar4 = p[1];
        p = p + 1;
      }
      if (bVar4 != 0x30) {
        local_238[uVar15 - 1] = local_238[uVar15 - 1] | 1;
        break;
      }
      p = p + 1;
      dig = dig - 1;
    } while (800 < dig);
LAB_0012b517:
    iVar2 = (int)__s;
    if (fmt != STRSCAN_INT) goto LAB_0012b57e;
    fmt = STRSCAN_NUM;
    if ((opt & 0x10) != 0) {
      return STRSCAN_ERROR;
    }
  }
  uVar1 = iVar2 - (int)local_238;
  uVar10 = ((int)uVar10 >> 1) + uVar1;
  if ((int)uVar10 < 0x9c) {
    if (-0xa4 < (int)uVar10) {
      uVar14 = 0;
      iVar2 = 0;
      if ((int)uVar10 < 9) {
        uVar14 = 0;
        do {
          uVar16 = (uint)uVar14;
          if ((int)(uVar1 - uVar16 & 0x1ff) <= (int)uVar10) goto LAB_0012b799;
          uVar15 = (ulong)(uVar1 - 1 & 0x1ff);
          uVar9 = (uint)local_238[uVar15] * 0x147b0;
          uVar7 = (uint)local_238[uVar15] << 6;
          while( true ) {
            uVar9 = uVar9 >> 0x11;
            iVar8 = uVar9 * -100 + uVar7;
            local_238[uVar15] = (byte)iVar8;
            uVar11 = (uint)uVar15;
            if (uVar11 == uVar16) break;
            if ((uVar1 - 1 & 0x1ff) == uVar11 && iVar8 == 0) {
              uVar1 = uVar11;
            }
            uVar15 = (ulong)(uVar11 - 1 & 0x1ff);
            uVar7 = (uint)local_238[uVar15] * 0x40 + uVar9;
            uVar9 = (uVar7 >> 2) * 0x147b;
          }
          if (99 < uVar7) {
            uVar11 = uVar16 - 1 & 0x1ff;
            uVar14 = (ulong)uVar11;
            uVar7 = uVar1 - 1 & 0x1ff;
            uVar16 = uVar7;
            if ((local_238[uVar7] != 0) && (uVar16 = uVar1, uVar11 == uVar1)) {
              local_238[uVar1 + 0x1fe & 0x1ff] = local_238[uVar1 + 0x1fe & 0x1ff] | local_238[uVar7]
              ;
              uVar16 = uVar7;
            }
            uVar1 = uVar16;
            local_238[uVar14] = (byte)uVar9;
            uVar10 = uVar10 + 1;
          }
          iVar2 = iVar2 + -6;
        } while ((int)uVar10 < 9);
      }
      uVar15 = uVar14;
      if (uVar10 < 10) {
        uVar10 = 9;
      }
      else {
        do {
          uVar16 = 0;
          uVar13 = uVar15;
          do {
            iVar12 = (int)uVar13;
            iVar8 = (int)uVar15;
            uVar9 = local_238[uVar15] + uVar16;
            local_238[uVar15] = (byte)(uVar9 >> 6);
            uVar7 = uVar9 & 0x3f;
            uVar16 = uVar7 * 100;
            bVar17 = (uVar9 & 0x3fc0) == 0;
            uVar14 = (ulong)(iVar12 + 1U & 0x1ff);
            if (iVar8 != iVar12 || !bVar17) {
              uVar14 = uVar13;
            }
            uVar10 = uVar10 - (iVar8 == iVar12 && bVar17);
            uVar11 = iVar8 + 1U & 0x1ff;
            uVar15 = (ulong)uVar11;
            uVar13 = uVar14;
            uVar9 = uVar1;
          } while (uVar11 != uVar1);
          while (uVar1 = uVar9, uVar7 != 0) {
            uVar1 = (uint)uVar14;
            if (uVar1 == uVar9) {
              local_238[uVar1 - 1 & 0x1ff] = local_238[uVar1 - 1 & 0x1ff] | 1;
              break;
            }
            local_238[uVar9] = (byte)(uVar16 >> 6);
            uVar7 = uVar16 & 0x3c;
            uVar16 = uVar7 * 100;
            uVar9 = uVar9 + 1 & 0x1ff;
          }
          iVar2 = iVar2 + 6;
          uVar15 = uVar14;
        } while (9 < (int)uVar10);
      }
LAB_0012b799:
      uVar15 = (ulong)local_238[uVar14];
      uVar7 = (int)uVar14 + 1U & 0x1ff;
      uVar16 = uVar10 - 1;
      uVar9 = uVar16;
      if (1 < (int)uVar10) {
        do {
          uVar16 = uVar9;
          if (uVar7 == uVar1) break;
          uVar15 = (ulong)local_238[uVar7] + uVar15 * 100;
          uVar7 = uVar7 + 1 & 0x1ff;
          uVar16 = uVar9 - 1;
          bVar17 = 1 < uVar9;
          uVar9 = uVar16;
        } while (bVar17);
      }
      if (uVar7 == uVar1) {
        if (0 < (int)uVar16) {
          uVar16 = uVar16 + 1;
          do {
            uVar15 = uVar15 * 100;
            uVar16 = uVar16 - 1;
          } while (1 < uVar16);
        }
      }
      else {
        uVar15 = uVar15 * 2;
        iVar2 = iVar2 + -1;
        do {
          if (local_238[uVar7] != 0) {
            uVar15 = uVar15 | 1;
            break;
          }
          uVar7 = uVar7 + 1 & 0x1ff;
        } while (uVar7 != uVar1);
      }
      strscan_double(uVar15,o,iVar2,neg);
      return fmt;
    }
    dVar18 = 0.0;
    if (neg != 0) {
      dVar18 = -0.0;
    }
LAB_0012b5dd:
    o->u64 = (uint64_t)dVar18;
    return fmt;
  }
  uVar14 = 0x7ff0000000000000;
  uVar15 = 0xfff0000000000000;
LAB_0012b5b7:
  if (neg == 0) {
    uVar15 = uVar14;
  }
  o->u64 = uVar15;
  return fmt;
}

Assistant:

static StrScanFmt strscan_dec(const uint8_t *p, TValue *o,
			      StrScanFmt fmt, uint32_t opt,
			      int32_t ex10, int32_t neg, uint32_t dig)
{
  uint8_t xi[STRSCAN_DDIG], *xip = xi;

  if (dig) {
    uint32_t i = dig;
    if (i > STRSCAN_MAXDIG) {
      ex10 += (int32_t)(i - STRSCAN_MAXDIG);
      i = STRSCAN_MAXDIG;
    }
    /* Scan unaligned leading digit. */
    if (((ex10^i) & 1))
      *xip++ = ((*p != '.' ? *p : *++p) & 15), i--, p++;
    /* Scan aligned double-digits. */
    for ( ; i > 1; i -= 2) {
      uint32_t d = 10 * ((*p != '.' ? *p : *++p) & 15); p++;
      *xip++ = d + ((*p != '.' ? *p : *++p) & 15); p++;
    }
    /* Scan and realign trailing digit. */
    if (i) *xip++ = 10 * ((*p != '.' ? *p : *++p) & 15), ex10--, dig++, p++;

    /* Summarize rounding-effect of excess digits. */
    if (dig > STRSCAN_MAXDIG) {
      do {
	if ((*p != '.' ? *p : *++p) != '0') { xip[-1] |= 1; break; }
	p++;
      } while (--dig > STRSCAN_MAXDIG);
      dig = STRSCAN_MAXDIG;
    } else {  /* Simplify exponent. */
      while (ex10 > 0 && dig <= 18) *xip++ = 0, ex10 -= 2, dig += 2;
    }
  } else {  /* Only got zeros. */
    ex10 = 0;
    xi[0] = 0;
  }

  /* Fast path for numbers in integer format (but handles e.g. 1e6, too). */
  if (dig <= 20 && ex10 == 0) {
    uint8_t *xis;
    uint64_t x = xi[0];
    double n;
    for (xis = xi+1; xis < xip; xis++) x = x * 100 + *xis;
    if (!(dig == 20 && (xi[0] > 18 || (int64_t)x >= 0))) {  /* No overflow? */
      /* Format-specific handling. */
      switch (fmt) {
      case STRSCAN_INT:
	if (!(opt & STRSCAN_OPT_TONUM) && x < 0x80000000u+neg) {
	  o->i = neg ? -(int32_t)x : (int32_t)x;
	  return STRSCAN_INT;  /* Fast path for 32 bit integers. */
	}
	if (!(opt & STRSCAN_OPT_C)) { fmt = STRSCAN_NUM; goto plainnumber; }
	/* fallthrough */
      case STRSCAN_U32:
	if ((x >> 32) != 0) return STRSCAN_ERROR;
	o->i = neg ? -(int32_t)x : (int32_t)x;
	return STRSCAN_U32;
      case STRSCAN_I64:
      case STRSCAN_U64:
	o->u64 = neg ? (uint64_t)-(int64_t)x : x;
	return fmt;
      default:
      plainnumber:  /* Fast path for plain numbers < 2^63. */
	if ((int64_t)x < 0) break;
	n = (double)(int64_t)x;
	if (neg) n = -n;
	o->n = n;
	return fmt;
      }
    }
  }

  /* Slow non-integer path. */
  if (fmt == STRSCAN_INT) {
    if ((opt & STRSCAN_OPT_C)) return STRSCAN_ERROR;
    fmt = STRSCAN_NUM;
  } else if (fmt > STRSCAN_INT) {
    return STRSCAN_ERROR;
  }
  {
    uint32_t hi = 0, lo = (uint32_t)(xip-xi);
    int32_t ex2 = 0, idig = (int32_t)lo + (ex10 >> 1);

    lj_assertX(lo > 0 && (ex10 & 1) == 0, "bad lo %d ex10 %d", lo, ex10);

    /* Handle simple overflow/underflow. */
    if (idig > 310/2) { if (neg) setminfV(o); else setpinfV(o); return fmt; }
    else if (idig < -326/2) { o->n = neg ? -0.0 : 0.0; return fmt; }

    /* Scale up until we have at least 17 or 18 integer part digits. */
    while (idig < 9 && idig < DLEN(lo, hi)) {
      uint32_t i, cy = 0;
      ex2 -= 6;
      for (i = DPREV(lo); ; i = DPREV(i)) {
	uint32_t d = (xi[i] << 6) + cy;
	cy = (((d >> 2) * 5243) >> 17); d = d - cy * 100;  /* Div/mod 100. */
	xi[i] = (uint8_t)d;
	if (i == hi) break;
	if (d == 0 && i == DPREV(lo)) lo = i;
      }
      if (cy) {
	hi = DPREV(hi);
	if (xi[DPREV(lo)] == 0) lo = DPREV(lo);
	else if (hi == lo) { lo = DPREV(lo); xi[DPREV(lo)] |= xi[lo]; }
	xi[hi] = (uint8_t)cy; idig++;
      }
    }

    /* Scale down until no more than 17 or 18 integer part digits remain. */
    while (idig > 9) {
      uint32_t i = hi, cy = 0;
      ex2 += 6;
      do {
	cy += xi[i];
	xi[i] = (cy >> 6);
	cy = 100 * (cy & 0x3f);
	if (xi[i] == 0 && i == hi) hi = DNEXT(hi), idig--;
	i = DNEXT(i);
      } while (i != lo);
      while (cy) {
	if (hi == lo) { xi[DPREV(lo)] |= 1; break; }
	xi[lo] = (cy >> 6); lo = DNEXT(lo);
	cy = 100 * (cy & 0x3f);
      }
    }

    /* Collect integer part digits and convert to rescaled double. */
    {
      uint64_t x = xi[hi];
      uint32_t i;
      for (i = DNEXT(hi); --idig > 0 && i != lo; i = DNEXT(i))
	x = x * 100 + xi[i];
      if (i == lo) {
	while (--idig >= 0) x = x * 100;
      } else {  /* Gather round bit from remaining digits. */
	x <<= 1; ex2--;
	do {
	  if (xi[i]) { x |= 1; break; }
	  i = DNEXT(i);
	} while (i != lo);
      }
      strscan_double(x, o, ex2, neg);
    }
  }
  return fmt;
}